

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::co_ord_to_path(three_dim_model *this,co_ord *in_vec,Path *out_path)

{
  bool bVar1;
  reference piVar2;
  undefined1 local_60 [8];
  IntPoint current_point;
  const_iterator point_it_x;
  const_iterator point_it_x_end;
  const_iterator point_it_y;
  Path holder_path;
  Path *out_path_local;
  co_ord *in_vec_local;
  three_dim_model *this_local;
  
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&point_it_y);
  point_it_x_end = std::vector<int,_std::allocator<int>_>::begin(&in_vec->y);
  point_it_x = std::vector<int,_std::allocator<int>_>::end(&in_vec->x);
  current_point.Y = (cInt)std::vector<int,_std::allocator<int>_>::begin(&in_vec->x);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &current_point.Y,&point_it_x);
    if (!bVar1) break;
    ClipperLib::IntPoint::IntPoint((IntPoint *)local_60,0,0);
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &current_point.Y);
    local_60 = (undefined1  [8])(long)*piVar2;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&point_it_x_end);
    current_point.X = (cInt)*piVar2;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&point_it_y,
               (value_type *)local_60);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&point_it_x_end,0);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &current_point.Y,0);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
            (out_path,(vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                      &point_it_y);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&point_it_y);
  return;
}

Assistant:

void MODEL3D::three_dim_model::co_ord_to_path(  const co_ord &in_vec,
                                                ClipperLib::Path &out_path)
{
    // for each point convert to clipper point
    // then push point to path
    ClipperLib::Path holder_path;
    auto point_it_y = in_vec.y.begin();
    auto point_it_x_end = in_vec.x.end();
    for (auto point_it_x = in_vec.x.begin(); point_it_x != point_it_x_end; point_it_x++)
    {
        ClipperLib::IntPoint current_point;
        current_point.X = *point_it_x;
        current_point.Y = *point_it_y;
        holder_path.push_back(current_point);
        point_it_y++;
    }
    out_path = holder_path;
}